

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

void __thiscall GameBoard::spawn_snake(GameBoard *this)

{
  pointer *pppSVar1;
  iterator __position;
  Snake *this_00;
  Snake *local_18;
  
  this_00 = (Snake *)operator_new(0x68);
  Snake::Snake(this_00,this);
  __position._M_current =
       (this->snakes).super__Vector_base<Snake_*,_std::allocator<Snake_*>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->snakes).super__Vector_base<Snake_*,_std::allocator<Snake_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    local_18 = this_00;
    std::vector<Snake*,std::allocator<Snake*>>::_M_realloc_insert<Snake*>
              ((vector<Snake*,std::allocator<Snake*>> *)&this->snakes,__position,&local_18);
  }
  else {
    *__position._M_current = this_00;
    pppSVar1 = &(this->snakes).super__Vector_base<Snake_*,_std::allocator<Snake_*>_>._M_impl.
                super__Vector_impl_data._M_finish;
    *pppSVar1 = *pppSVar1 + 1;
  }
  return;
}

Assistant:

void GameBoard::spawn_snake() {
    this->snakes.push_back(new Snake(this));
}